

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::memory::anon_unknown_0::RandomMemoryMappingInstance::iterate
          (TestStatus *__return_storage_ptr__,RandomMemoryMappingInstance *this)

{
  pointer *this_00;
  bool bVar1;
  deUint32 dVar2;
  iterator first;
  iterator last;
  reference pSVar3;
  MemoryHeap *pMVar4;
  pointer pSVar5;
  MemoryMapping *pMVar6;
  float fVar7;
  MemoryMapping *local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  MemoryMapping *local_198;
  MemoryObject_conflict *local_190;
  MemoryObject_conflict *object_4;
  __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>_>
  local_180;
  MemoryHeap *local_178;
  MemoryHeap *heap_1;
  MemoryObject_conflict *object_3;
  __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>_>
  local_160;
  MemoryHeap *local_158;
  MemoryHeap *heap;
  __normal_iterator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
  local_148;
  __normal_iterator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
  local_140;
  __normal_iterator<const_de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
  local_138;
  const_iterator heapIter_1;
  MemoryHeap *local_128;
  __normal_iterator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
  local_120;
  __normal_iterator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
  local_118;
  __normal_iterator<const_de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
  local_110;
  const_iterator heapIter;
  undefined1 local_f8 [8];
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  nonEmptyHeaps;
  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
  nonFullHeaps;
  MemoryMapping *mapping_1;
  MemoryObject_conflict *local_b0;
  MemoryObject_conflict *object_2;
  MemoryObject_conflict **local_a0;
  __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
  local_98;
  MemoryObject_conflict *local_90;
  MemoryObject_conflict *object_1;
  __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
  local_80;
  MemoryObject_conflict *local_78;
  MemoryObject_conflict *object;
  iterator iStack_68;
  Op op;
  __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryMapping_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>_>
  local_60;
  MemoryMapping *local_58;
  MemoryMapping *mapping;
  VkDeviceSize sysMemUsage;
  DeviceInterface *vkd;
  VkDevice device;
  undefined4 local_30;
  float allocProbability;
  float unmapProbability;
  float mapProbability;
  float flushInvalidateProbability;
  float memoryOpProbability;
  size_t opCount;
  RandomMemoryMappingInstance *this_local;
  
  _flushInvalidateProbability = 100;
  mapProbability = 0.5;
  unmapProbability = 0.4;
  allocProbability = 0.5;
  local_30 = 0x3e800000;
  device._4_4_ = 0x3f400000;
  opCount = (size_t)this;
  this_local = (RandomMemoryMappingInstance *)__return_storage_ptr__;
  vkd = (DeviceInterface *)vkt::Context::getDevice((this->super_TestInstance).m_context);
  sysMemUsage = (VkDeviceSize)vkt::Context::getDeviceInterface((this->super_TestInstance).m_context)
  ;
  if ((this->m_memoryLimits).totalDeviceLocalMemory == 0) {
    local_1e0 = (MemoryMapping *)TotalMemoryTracker::getTotalUsage(&this->m_totalMemTracker);
  }
  else {
    local_1e0 = (MemoryMapping *)
                TotalMemoryTracker::getUsage(&this->m_totalMemTracker,MEMORY_CLASS_SYSTEM);
  }
  mapping = local_1e0;
  bVar1 = std::
          vector<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
          ::empty(&this->m_memoryMappings);
  if ((bVar1) || (fVar7 = de::Random::getFloat(&this->m_rng), 0.5 <= fVar7)) {
    bVar1 = std::
            vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
            ::empty(&this->m_mappedMemoryObjects);
    if ((bVar1) || (fVar7 = de::Random::getFloat(&this->m_rng), 0.4 <= fVar7)) {
      bVar1 = std::
              vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
              ::empty(&this->m_mappedMemoryObjects);
      if ((bVar1) || (fVar7 = de::Random::getFloat(&this->m_rng), 0.25 <= fVar7)) {
        bVar1 = std::
                vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                ::empty(&this->m_nonMappedMemoryObjects);
        if (((bVar1) || (fVar7 = de::Random::getFloat(&this->m_rng), 0.5 <= fVar7)) ||
           ((this->m_memoryLimits).totalSystemMemory <
            (long)&(mapping->m_range).offset + this->m_memoryMappingSysMemSize)) {
          std::
          vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
          ::vector((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                    *)&nonEmptyHeaps.
                       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
          ::vector((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                    *)local_f8);
          if ((this->m_memoryLimits).totalSystemMemory <
              (long)&(mapping->m_range).offset + this->m_memoryObjectSysMemSize) {
            local_140._M_current =
                 (SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap> *)
                 std::
                 vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                 ::begin(&this->m_memoryHeaps);
            __gnu_cxx::
            __normal_iterator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>const*,std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>>>>
            ::__normal_iterator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>*>
                      ((__normal_iterator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>const*,std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>>>>
                        *)&local_138,&local_140);
            while( true ) {
              local_148._M_current =
                   (SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap> *)
                   std::
                   vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                   ::end(&this->m_memoryHeaps);
              bVar1 = __gnu_cxx::operator!=(&local_138,&local_148);
              if (!bVar1) break;
              pSVar3 = __gnu_cxx::
                       __normal_iterator<const_de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
                       ::operator*(&local_138);
              pMVar4 = de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>::operator->
                                 (pSVar3);
              bVar1 = MemoryHeap::empty(pMVar4);
              if (!bVar1) {
                pSVar5 = __gnu_cxx::
                         __normal_iterator<const_de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
                         ::operator->(&local_138);
                heap = de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>::get(pSVar5);
                std::
                vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                             *)local_f8,&heap);
              }
              __gnu_cxx::
              __normal_iterator<const_de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
              ::operator++(&local_138);
            }
          }
          else {
            TotalMemoryTracker::allocate
                      (&this->m_totalMemTracker,MEMORY_CLASS_SYSTEM,this->m_memoryObjectSysMemSize);
            local_118._M_current =
                 (SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap> *)
                 std::
                 vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                 ::begin(&this->m_memoryHeaps);
            __gnu_cxx::
            __normal_iterator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>const*,std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>>>>
            ::__normal_iterator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>*>
                      ((__normal_iterator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>const*,std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>>>>
                        *)&local_110,&local_118);
            while( true ) {
              local_120._M_current =
                   (SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap> *)
                   std::
                   vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>
                   ::end(&this->m_memoryHeaps);
              bVar1 = __gnu_cxx::operator!=(&local_110,&local_120);
              if (!bVar1) break;
              pSVar3 = __gnu_cxx::
                       __normal_iterator<const_de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
                       ::operator*(&local_110);
              pMVar4 = de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>::operator->
                                 (pSVar3);
              bVar1 = MemoryHeap::full(pMVar4);
              if (!bVar1) {
                pSVar5 = __gnu_cxx::
                         __normal_iterator<const_de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
                         ::operator->(&local_110);
                local_128 = de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>::get
                                      (pSVar5);
                std::
                vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                             *)&nonEmptyHeaps.
                                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_128);
              }
              pSVar3 = __gnu_cxx::
                       __normal_iterator<const_de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
                       ::operator*(&local_110);
              pMVar4 = de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>::operator->
                                 (pSVar3);
              bVar1 = MemoryHeap::empty(pMVar4);
              if (!bVar1) {
                pSVar5 = __gnu_cxx::
                         __normal_iterator<const_de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
                         ::operator->(&local_110);
                heapIter_1._M_current =
                     (SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap> *)
                     de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>::get(pSVar5);
                std::
                vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                ::push_back((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                             *)local_f8,(value_type *)&heapIter_1);
              }
              __gnu_cxx::
              __normal_iterator<const_de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_*,_std::vector<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>,_std::allocator<de::SharedPtr<vkt::memory::(anonymous_namespace)::MemoryHeap>_>_>_>
              ::operator++(&local_110);
            }
            TotalMemoryTracker::free(&this->m_totalMemTracker,(void *)0x0);
          }
          bVar1 = std::
                  vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                  ::empty((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                           *)&nonEmptyHeaps.
                              super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((bVar1) ||
             ((bVar1 = std::
                       vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                       ::empty((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                                *)local_f8), !bVar1 &&
              (fVar7 = de::Random::getFloat(&this->m_rng), 0.75 <= fVar7)))) {
            local_180._M_current =
                 (MemoryHeap **)
                 std::
                 vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                 ::begin((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                          *)local_f8);
            object_4 = (MemoryObject_conflict *)
                       std::
                       vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                       ::end((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                              *)local_f8);
            local_178 = de::Random::
                        choose<vkt::memory::(anonymous_namespace)::MemoryHeap*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap**,std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap*>>>>
                                  (&this->m_rng,local_180,
                                   (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>_>
                                    )object_4);
            local_190 = MemoryHeap::getRandomObject(local_178,&this->m_rng);
            pMVar6 = MemoryObject::getMapping((MemoryObject *)local_190);
            if (pMVar6 != (MemoryMapping *)0x0) {
              local_198 = MemoryObject::getMapping((MemoryObject *)local_190);
              memory::(anonymous_namespace)::
              removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryMapping*>
                        (&this->m_memoryMappings,&local_198);
              TotalMemoryTracker::free(&this->m_totalMemTracker,(void *)0x0);
            }
            memory::(anonymous_namespace)::
            removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryObject*>
                      (&this->m_mappedMemoryObjects,&local_190);
            memory::(anonymous_namespace)::
            removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryObject*>
                      (&this->m_nonMappedMemoryObjects,&local_190);
            MemoryHeap::free(local_178,local_190);
            TotalMemoryTracker::free(&this->m_totalMemTracker,(void *)0x0);
          }
          else {
            TotalMemoryTracker::allocate
                      (&this->m_totalMemTracker,MEMORY_CLASS_SYSTEM,this->m_memoryObjectSysMemSize);
            this_00 = &nonEmptyHeaps.
                       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_160._M_current =
                 (MemoryHeap **)
                 std::
                 vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                 ::begin((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                          *)this_00);
            object_3 = (MemoryObject_conflict *)
                       std::
                       vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                       ::end((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                              *)this_00);
            local_158 = de::Random::
                        choose<vkt::memory::(anonymous_namespace)::MemoryHeap*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap**,std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap*>>>>
                                  (&this->m_rng,local_160,
                                   (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryHeap_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>_>
                                    )object_3);
            heap_1 = (MemoryHeap *)
                     MemoryHeap::allocateRandom
                               (local_158,(DeviceInterface *)sysMemUsage,(VkDevice)vkd,&this->m_rng)
            ;
            std::
            vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
            ::push_back(&this->m_nonMappedMemoryObjects,(value_type *)&heap_1);
          }
          std::
          vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
          ::~vector((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                     *)local_f8);
          std::
          vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
          ::~vector((vector<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                     *)&nonEmptyHeaps.
                        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          first = std::
                  vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                  ::begin(&this->m_nonMappedMemoryObjects);
          last = std::
                 vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ::end(&this->m_nonMappedMemoryObjects);
          local_b0 = de::Random::
                     choose<vkt::memory::(anonymous_namespace)::MemoryObject*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject**,std::vector<vkt::memory::(anonymous_namespace)::MemoryObject*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject*>>>>
                               (&this->m_rng,
                                (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                                 )first._M_current,
                                (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                                 )last._M_current);
          nonFullHeaps.
          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)MemoryObject::mapRandom
                                  ((MemoryObject *)local_b0,(DeviceInterface *)sysMemUsage,
                                   (VkDevice)vkd,&this->m_rng);
          std::
          vector<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
          ::push_back(&this->m_memoryMappings,
                      (value_type *)
                      &nonFullHeaps.
                       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryHeap_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryHeap_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
          ::push_back(&this->m_mappedMemoryObjects,&local_b0);
          memory::(anonymous_namespace)::
          removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryObject*>
                    (&this->m_nonMappedMemoryObjects,&local_b0);
          TotalMemoryTracker::allocate
                    (&this->m_totalMemTracker,MEMORY_CLASS_SYSTEM,this->m_memoryMappingSysMemSize);
        }
      }
      else {
        local_98._M_current =
             (MemoryObject_conflict **)
             std::
             vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
             ::begin(&this->m_mappedMemoryObjects);
        local_a0 = (MemoryObject_conflict **)
                   std::
                   vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                   ::end(&this->m_mappedMemoryObjects);
        local_90 = de::Random::
                   choose<vkt::memory::(anonymous_namespace)::MemoryObject*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject**,std::vector<vkt::memory::(anonymous_namespace)::MemoryObject*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject*>>>>
                             (&this->m_rng,local_98,
                              (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                               )local_a0);
        object_2 = (MemoryObject_conflict *)MemoryObject::getMapping((MemoryObject *)local_90);
        memory::(anonymous_namespace)::
        removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryMapping*>
                  (&this->m_memoryMappings,(MemoryMapping **)&object_2);
        MemoryObject::unmap((MemoryObject *)local_90);
        memory::(anonymous_namespace)::
        removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryObject*>
                  (&this->m_mappedMemoryObjects,&local_90);
        std::
        vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
        ::push_back(&this->m_nonMappedMemoryObjects,&local_90);
        TotalMemoryTracker::free(&this->m_totalMemTracker,(void *)0x0);
      }
    }
    else {
      local_80._M_current =
           (MemoryObject_conflict **)
           std::
           vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
           ::begin(&this->m_mappedMemoryObjects);
      object_1 = (MemoryObject_conflict *)
                 std::
                 vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                 ::end(&this->m_mappedMemoryObjects);
      local_78 = de::Random::
                 choose<vkt::memory::(anonymous_namespace)::MemoryObject*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject**,std::vector<vkt::memory::(anonymous_namespace)::MemoryObject*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject*>>>>
                           (&this->m_rng,local_80,
                            (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                             )object_1);
      bVar1 = de::Random::getBool(&this->m_rng);
      if (bVar1) {
        MemoryObject::randomFlush
                  ((MemoryObject *)local_78,(DeviceInterface *)sysMemUsage,(VkDevice)vkd,
                   &this->m_rng);
      }
      else {
        MemoryObject::randomInvalidate
                  ((MemoryObject *)local_78,(DeviceInterface *)sysMemUsage,(VkDevice)vkd,
                   &this->m_rng);
      }
    }
  }
  else {
    local_60._M_current =
         (MemoryMapping **)
         std::
         vector<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
         ::begin(&this->m_memoryMappings);
    iStack_68 = std::
                vector<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>
                ::end(&this->m_memoryMappings);
    local_58 = de::Random::
               choose<vkt::memory::(anonymous_namespace)::MemoryMapping*,__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryMapping**,std::vector<vkt::memory::(anonymous_namespace)::MemoryMapping*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping*>>>>
                         (&this->m_rng,local_60,
                          (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryMapping_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryMapping_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryMapping_*>_>_>
                           )iStack_68._M_current);
    dVar2 = de::Random::getUint32(&this->m_rng);
    object._4_4_ = dVar2 % 3;
    if (object._4_4_ == 0) {
      MemoryMapping::randomRead(local_58,&this->m_rng);
    }
    else if (object._4_4_ == 1) {
      MemoryMapping::randomWrite(local_58,&this->m_rng);
    }
    else if (object._4_4_ == 2) {
      MemoryMapping::randomModify(local_58,&this->m_rng);
    }
  }
  this->m_opNdx = this->m_opNdx + 1;
  if (this->m_opNdx == 100) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"Pass",&local_1b9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
  }
  else {
    tcu::TestStatus::incomplete();
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const size_t			opCount						= 100;
		const float				memoryOpProbability			= 0.5f;		// 0.50
		const float				flushInvalidateProbability	= 0.4f;		// 0.20
		const float				mapProbability				= 0.50f;	// 0.15
		const float				unmapProbability			= 0.25f;	// 0.075

		const float				allocProbability			= 0.75f; // Versun free

		const VkDevice			device						= m_context.getDevice();
		const DeviceInterface&	vkd							= m_context.getDeviceInterface();

		const VkDeviceSize		sysMemUsage					= (m_memoryLimits.totalDeviceLocalMemory == 0)
															? m_totalMemTracker.getTotalUsage()
															: m_totalMemTracker.getUsage(MEMORY_CLASS_SYSTEM);

		if (!m_memoryMappings.empty() && m_rng.getFloat() < memoryOpProbability)
		{
			// Perform operations on mapped memory
			MemoryMapping* const	mapping	= m_rng.choose<MemoryMapping*>(m_memoryMappings.begin(), m_memoryMappings.end());

			enum Op
			{
				OP_READ = 0,
				OP_WRITE,
				OP_MODIFY,
				OP_LAST
			};

			const Op op = (Op)(m_rng.getUint32() % OP_LAST);

			switch (op)
			{
				case OP_READ:
					mapping->randomRead(m_rng);
					break;

				case OP_WRITE:
					mapping->randomWrite(m_rng);
					break;

				case OP_MODIFY:
					mapping->randomModify(m_rng);
					break;

				default:
					DE_FATAL("Invalid operation");
			}
		}
		else if (!m_mappedMemoryObjects.empty() && m_rng.getFloat() < flushInvalidateProbability)
		{
			MemoryObject* const	object	= m_rng.choose<MemoryObject*>(m_mappedMemoryObjects.begin(), m_mappedMemoryObjects.end());

			if (m_rng.getBool())
				object->randomFlush(vkd, device, m_rng);
			else
				object->randomInvalidate(vkd, device, m_rng);
		}
		else if (!m_mappedMemoryObjects.empty() && m_rng.getFloat() < unmapProbability)
		{
			// Unmap memory object
			MemoryObject* const	object	= m_rng.choose<MemoryObject*>(m_mappedMemoryObjects.begin(), m_mappedMemoryObjects.end());

			// Remove mapping
			removeFirstEqual(m_memoryMappings, object->getMapping());

			object->unmap();
			removeFirstEqual(m_mappedMemoryObjects, object);
			m_nonMappedMemoryObjects.push_back(object);

			m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryMappingSysMemSize);
		}
		else if (!m_nonMappedMemoryObjects.empty() &&
				 (m_rng.getFloat() < mapProbability) &&
				 (sysMemUsage+m_memoryMappingSysMemSize <= (VkDeviceSize)m_memoryLimits.totalSystemMemory))
		{
			// Map memory object
			MemoryObject* const		object	= m_rng.choose<MemoryObject*>(m_nonMappedMemoryObjects.begin(), m_nonMappedMemoryObjects.end());
			MemoryMapping*			mapping	= object->mapRandom(vkd, device, m_rng);

			m_memoryMappings.push_back(mapping);
			m_mappedMemoryObjects.push_back(object);
			removeFirstEqual(m_nonMappedMemoryObjects, object);

			m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryMappingSysMemSize);
		}
		else
		{
			// Sort heaps based on capacity (full or not)
			vector<MemoryHeap*>		nonFullHeaps;
			vector<MemoryHeap*>		nonEmptyHeaps;

			if (sysMemUsage+m_memoryObjectSysMemSize <= (VkDeviceSize)m_memoryLimits.totalSystemMemory)
			{
				// For the duration of sorting reserve MemoryObject space from system memory
				m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);

				for (vector<de::SharedPtr<MemoryHeap> >::const_iterator heapIter = m_memoryHeaps.begin();
					 heapIter != m_memoryHeaps.end();
					 ++heapIter)
				{
					if (!(*heapIter)->full())
						nonFullHeaps.push_back(heapIter->get());

					if (!(*heapIter)->empty())
						nonEmptyHeaps.push_back(heapIter->get());
				}

				m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);
			}
			else
			{
				// Not possible to even allocate MemoryObject from system memory, look for non-empty heaps
				for (vector<de::SharedPtr<MemoryHeap> >::const_iterator heapIter = m_memoryHeaps.begin();
					 heapIter != m_memoryHeaps.end();
					 ++heapIter)
				{
					if (!(*heapIter)->empty())
						nonEmptyHeaps.push_back(heapIter->get());
				}
			}

			if (!nonFullHeaps.empty() && (nonEmptyHeaps.empty() || m_rng.getFloat() < allocProbability))
			{
				// Reserve MemoryObject from sys mem first
				m_totalMemTracker.allocate(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);

				// Allocate more memory objects
				MemoryHeap* const	heap	= m_rng.choose<MemoryHeap*>(nonFullHeaps.begin(), nonFullHeaps.end());
				MemoryObject* const	object	= heap->allocateRandom(vkd, device, m_rng);

				m_nonMappedMemoryObjects.push_back(object);
			}
			else
			{
				// Free memory objects
				MemoryHeap* const		heap	= m_rng.choose<MemoryHeap*>(nonEmptyHeaps.begin(), nonEmptyHeaps.end());
				MemoryObject* const		object	= heap->getRandomObject(m_rng);

				// Remove mapping
				if (object->getMapping())
				{
					removeFirstEqual(m_memoryMappings, object->getMapping());
					m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, m_memoryMappingSysMemSize);
				}

				removeFirstEqual(m_mappedMemoryObjects, object);
				removeFirstEqual(m_nonMappedMemoryObjects, object);

				heap->free(object);
				m_totalMemTracker.free(MEMORY_CLASS_SYSTEM, (VkDeviceSize)m_memoryObjectSysMemSize);
			}
		}

		m_opNdx += 1;
		if (m_opNdx == opCount)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::incomplete();
	}